

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O2

string * __thiscall
embree::stringOfCPUFeatures_abi_cxx11_(string *__return_storage_ptr__,embree *this,int features)

{
  uint uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar1 = (uint)this;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((uVar1 >> 0x19 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x1a & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x1b & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (((ulong)this & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (((ulong)this & 2) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (((ulong)this & 4) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (((ulong)this & 8) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (((ulong)this & 0x10) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (((ulong)this & 0x20) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (((ulong)this & 0x40) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((char)this < '\0') {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x12 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x13 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x14 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x15 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x16 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x17 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x1c & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((uVar1 >> 0x1d & 1) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringOfCPUFeatures(int features)
  {
    std::string str;
    if (features & CPU_FEATURE_XMM_ENABLED) str += "XMM ";
    if (features & CPU_FEATURE_YMM_ENABLED) str += "YMM ";
    if (features & CPU_FEATURE_ZMM_ENABLED) str += "ZMM ";
    if (features & CPU_FEATURE_SSE   ) str += "SSE ";
    if (features & CPU_FEATURE_SSE2  ) str += "SSE2 ";
    if (features & CPU_FEATURE_SSE3  ) str += "SSE3 ";
    if (features & CPU_FEATURE_SSSE3 ) str += "SSSE3 ";
    if (features & CPU_FEATURE_SSE41 ) str += "SSE4.1 ";
    if (features & CPU_FEATURE_SSE42 ) str += "SSE4.2 ";
    if (features & CPU_FEATURE_POPCNT) str += "POPCNT ";
    if (features & CPU_FEATURE_AVX   ) str += "AVX ";
    if (features & CPU_FEATURE_F16C  ) str += "F16C ";
    if (features & CPU_FEATURE_RDRAND) str += "RDRAND ";
    if (features & CPU_FEATURE_AVX2  ) str += "AVX2 ";
    if (features & CPU_FEATURE_FMA3  ) str += "FMA3 ";
    if (features & CPU_FEATURE_LZCNT ) str += "LZCNT ";
    if (features & CPU_FEATURE_BMI1  ) str += "BMI1 ";
    if (features & CPU_FEATURE_BMI2  ) str += "BMI2 ";
    if (features & CPU_FEATURE_AVX512F) str += "AVX512F ";
    if (features & CPU_FEATURE_AVX512DQ) str += "AVX512DQ ";
    if (features & CPU_FEATURE_AVX512PF) str += "AVX512PF ";
    if (features & CPU_FEATURE_AVX512ER) str += "AVX512ER ";
    if (features & CPU_FEATURE_AVX512CD) str += "AVX512CD ";
    if (features & CPU_FEATURE_AVX512BW) str += "AVX512BW ";
    if (features & CPU_FEATURE_AVX512VL) str += "AVX512VL ";
    if (features & CPU_FEATURE_AVX512IFMA) str += "AVX512IFMA ";
    if (features & CPU_FEATURE_AVX512VBMI) str += "AVX512VBMI ";
    if (features & CPU_FEATURE_NEON) str += "NEON ";
    if (features & CPU_FEATURE_NEON_2X) str += "2xNEON ";
    return str;
  }